

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O3

void __thiscall
xray_re::xr_mesh_vbuf::push(xr_mesh_vbuf *this,xr_vbuf *vb,xr_ibuf *ib,fmatrix *xform)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  fvector2 fVar4;
  ulong uVar5;
  fvector3 *pfVar6;
  uint16_t *puVar7;
  fvector3 *pfVar8;
  size_t sVar9;
  fvector2 *pfVar10;
  finfluence *pfVar11;
  finfluence *pfVar12;
  fvector2 fVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  ulong uVar19;
  size_t sVar20;
  long lVar21;
  xr_mesh_vbuf *this_00;
  size_t sVar22;
  ulong reserved;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  
  uVar18 = (this->super_xr_vbuf).m_signature;
  sVar22 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
  if (uVar18 == 0) {
    if (sVar22 != 0) {
      __assert_fail("size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x43,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    uVar18 = vb->m_signature;
    (this->super_xr_vbuf).m_signature = uVar18;
    sVar22 = 0;
  }
  reserved = sVar22 + (vb->super_xr_flexbuf).m_size;
  this_00 = this;
  if (this->m_reserved < reserved) {
    reserve(this,reserved);
    uVar18 = (this->super_xr_vbuf).m_signature;
  }
  if ((uVar18 & 1) != 0) {
    if ((vb->m_signature & 1) == 0) {
      __assert_fail("vb.has_points()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x4a,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    if (xform == (fmatrix *)0x0) {
      sVar22 = (vb->super_xr_flexbuf).m_size;
      if (sVar22 != 0) {
        memmove((this->super_xr_vbuf).m_points + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
                vb->m_points,sVar22 * 0xc);
      }
    }
    else {
      transform_points(this_00,vb->m_points,
                       (this->super_xr_vbuf).m_points +
                       (this->super_xr_vbuf).super_xr_flexbuf.m_size,(vb->super_xr_flexbuf).m_size,
                       xform);
    }
  }
  if (((this->super_xr_vbuf).m_signature & 2) != 0) {
    if ((vb->m_signature & 2) == 0) {
      if (ib == (xr_ibuf *)0x0) {
        __assert_fail("ib",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                      ,0x59,
                      "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                     );
      }
      uVar5 = (ib->super_xr_flexbuf).m_size;
      if (uVar5 != 0) {
        sVar22 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
        pfVar6 = (this->super_xr_vbuf).m_normals;
        uVar19 = 0;
        do {
          puVar7 = ib->m_indices;
          pfVar8 = vb->m_points;
          uVar14 = (ulong)puVar7[uVar19];
          uVar15 = (ulong)puVar7[uVar19 + 1];
          uVar16 = (ulong)puVar7[uVar19 + 2];
          fVar31 = pfVar8[uVar14].field_0.field_0.x;
          uVar27 = *(undefined8 *)((long)&pfVar8[uVar15].field_0 + 4);
          fVar26 = pfVar8[uVar15].field_0.field_0.x - fVar31;
          uVar3 = *(undefined8 *)((long)&pfVar8[uVar14].field_0 + 4);
          fVar23 = (float)uVar3;
          fVar24 = (float)uVar27 - fVar23;
          fVar32 = (float)((ulong)uVar3 >> 0x20);
          fVar25 = (float)((ulong)uVar27 >> 0x20) - fVar32;
          fVar23 = pfVar8[uVar16].field_0.field_0.y - fVar23;
          fVar30 = pfVar8[uVar16].field_0.field_0.z - fVar32;
          fVar31 = pfVar8[uVar16].field_0.field_0.x - fVar31;
          auVar28._0_4_ = fVar24 * fVar30 - fVar23 * fVar25;
          auVar28._4_4_ = fVar25 * fVar31 - fVar30 * fVar26;
          auVar28._8_4_ = (0.0 - fVar32) * 0.0 - fVar30 * fVar25;
          auVar28._12_4_ = (0.0 - fVar32) * 0.0 - fVar30 * fVar25;
          fVar31 = fVar23 * fVar26 - fVar31 * fVar24;
          fVar23 = SQRT(fVar31 * fVar31 +
                        auVar28._0_4_ * auVar28._0_4_ + auVar28._4_4_ * auVar28._4_4_);
          fVar31 = fVar31 / fVar23;
          auVar29._4_4_ = fVar23;
          auVar29._0_4_ = fVar23;
          auVar29._8_8_ = 0;
          auVar29 = divps(auVar28,auVar29);
          uVar27 = auVar29._0_8_;
          *(undefined8 *)&pfVar6[sVar22 + uVar14].field_0 = uVar27;
          pfVar6[sVar22 + uVar14].field_0.field_0.z = fVar31;
          *(undefined8 *)&pfVar6[sVar22 + uVar15].field_0 = uVar27;
          pfVar6[sVar22 + uVar15].field_0.field_0.z = fVar31;
          *(undefined8 *)&pfVar6[sVar22 + uVar16].field_0 = uVar27;
          pfVar6[sVar22 + uVar16].field_0.field_0.z = fVar31;
          uVar19 = uVar19 + 3;
        } while (uVar19 < uVar5);
      }
    }
    else {
      sVar22 = (vb->super_xr_flexbuf).m_size;
      if (sVar22 != 0) {
        memmove((this->super_xr_vbuf).m_normals + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
                vb->m_normals,sVar22 * 0xc);
      }
    }
  }
  if (((this->super_xr_vbuf).m_signature & 4) != 0) {
    if ((vb->m_signature & 4) == 0) {
      __assert_fail("vb.has_texcoords()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x68,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    sVar22 = (vb->super_xr_flexbuf).m_size;
    if (sVar22 != 0) {
      memmove((this->super_xr_vbuf).m_texcoords + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
              vb->m_texcoords,sVar22 << 3);
    }
    if ((this->m_tc_fix == true) && (sVar22 = (vb->super_xr_flexbuf).m_size, sVar22 != 0)) {
      sVar9 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
      pfVar10 = (this->super_xr_vbuf).m_texcoords;
      sVar20 = 0;
      do {
        fVar4.field_0 =
             (anon_union_8_3_f28016de_for__vector2<float>_1)
             *(anon_union_8_3_f28016de_for__vector2<float>_1 *)
              &pfVar10[sVar9 + sVar20].field_0.field_0;
        fVar13.field_0.field_0.y = fVar4.field_0._4_4_ * 0.5;
        fVar13.field_0.field_0.x = fVar4.field_0._0_4_ * 0.5;
        pfVar10[sVar9 + sVar20].field_0 = fVar13.field_0;
        sVar20 = sVar20 + 1;
      } while (sVar22 != sVar20);
    }
  }
  uVar18 = (this->super_xr_vbuf).m_signature;
  if ((uVar18 & 0x10) != 0) {
    if ((vb->m_signature & 0x10) == 0) {
      __assert_fail("vb.has_influences()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x72,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    sVar22 = (vb->super_xr_flexbuf).m_size;
    if (sVar22 != 0) {
      sVar9 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
      pfVar11 = (this->super_xr_vbuf).m_influences;
      pfVar12 = vb->m_influences;
      lVar21 = 0;
      do {
        *(undefined4 *)
         ((long)(pfVar11[sVar9].super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>.array
                + 4) + lVar21) =
             *(undefined4 *)
              ((long)((pfVar12->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                      array + 4) + lVar21);
        puVar1 = (undefined8 *)
                 ((long)&(pfVar12->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                         array[0].bone + lVar21);
        uVar27 = *puVar1;
        uVar3 = puVar1[1];
        puVar1 = (undefined8 *)
                 ((long)&(pfVar12->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                         array[2].bone + lVar21);
        uVar17 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&pfVar11[sVar9].
                         super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>.array[2].
                         bone + lVar21);
        *puVar2 = *puVar1;
        puVar2[1] = uVar17;
        puVar1 = (undefined8 *)
                 ((long)&pfVar11[sVar9].
                         super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>.array[0].
                         bone + lVar21);
        *puVar1 = uVar27;
        puVar1[1] = uVar3;
        lVar21 = lVar21 + 0x24;
      } while (sVar22 * 0x24 != lVar21);
      uVar18 = (this->super_xr_vbuf).m_signature;
    }
  }
  if ((uVar18 & 0x20) != 0) {
    if ((vb->m_signature & 0x20) == 0) {
      __assert_fail("vb.has_colors()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_vbuf.cxx"
                    ,0x76,
                    "void xray_re::xr_mesh_vbuf::push(const xr_vbuf &, const xr_ibuf *, const fmatrix *)"
                   );
    }
    sVar22 = (vb->super_xr_flexbuf).m_size;
    if (sVar22 != 0) {
      memmove((this->super_xr_vbuf).m_colors + (this->super_xr_vbuf).super_xr_flexbuf.m_size,
              vb->m_colors,sVar22 << 4);
    }
  }
  (this->super_xr_vbuf).super_xr_flexbuf.m_size = reserved;
  return;
}

Assistant:

void xr_mesh_vbuf::push(const xr_vbuf& vb, const xr_ibuf* ib, const fmatrix* xform)
{
	if (signature() == 0) {
		xr_assert(size() == 0);
		set_signature(vb.signature());
	}
	size_t new_size = size() + vb.size();
	if (m_reserved < new_size)
		reserve(new_size);
	if (has_points()) {
		xr_assert(vb.has_points());
		if (xform)
			transform_points(vb.p(), m_points + size(), vb.size(), *xform);
		else
			copy(vb.p(), m_points + size(), vb.size());
	}
	if (has_normals()) {
		if (vb.has_normals()) {
			if (false && xform)
				transform_normals(vb.n(), m_normals + size(), vb.size(), *xform);
			else
				copy(vb.n(), m_normals + size(), vb.size());
		} else {
			// generate fake normals for 1xxx builds.
			// FIXME (maybe): this will not work correctly for the duplicate faces.
			xr_assert(ib);
			fvector3* normals = m_normals + size();
			for (size_t i = 0, num_indices = ib->size(); i < num_indices; i += 3) {
				uint32_t v0 = (*ib)[i + 0];
				uint32_t v1 = (*ib)[i + 1];
				uint32_t v2 = (*ib)[i + 2];
				fvector3 normal;
				normal.calc_normal(vb.p(v0), vb.p(v1), vb.p(v2));
				normals[v0].set(normal);
				normals[v1].set(normal);
				normals[v2].set(normal);
			}
		}
	}
	if (has_texcoords()) {
		xr_assert(vb.has_texcoords());
		copy(vb.tc(), m_texcoords + size(), vb.size());
		if (m_tc_fix) {
			fvector2* uv = m_texcoords + size();
			for (size_t n = vb.size(); n != 0; --n, ++uv)
				uv->mul(0.5f);
		}
	}
	// intentionally ignoring lightmaps here
	if (has_influences()) {
		xr_assert(vb.has_influences());
		copy(vb.w(), m_influences + size(), vb.size());
	}
	if (has_colors()) {
		xr_assert(vb.has_colors());
		copy(vb.c(), m_colors + size(), vb.size());
	}
	set_size(new_size);
}